

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,true,false>
               (timestamp_t *ldata,timestamp_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  int64_t *piVar8;
  ulong uVar9;
  interval_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar8 = &result_data->micros;
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      iVar10 = Interval::GetDifference((timestamp_t)ldata->value,(timestamp_t)rdata[iVar6].value);
      ((interval_t *)(piVar8 + -1))->months = (int)iVar10._0_8_;
      ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
      *piVar8 = iVar10.micros;
      piVar8 = piVar8 + 2;
    }
  }
  else {
    uVar7 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
LAB_014f21db:
        piVar8 = &result_data[uVar7].micros;
        for (; uVar3 = uVar7, uVar7 < uVar5; uVar7 = uVar7 + 1) {
          iVar10 = Interval::GetDifference
                             ((timestamp_t)ldata->value,(timestamp_t)rdata[uVar7].value);
          ((interval_t *)(piVar8 + -1))->months = (int)iVar10._0_8_;
          ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
          *piVar8 = iVar10.micros;
          piVar8 = piVar8 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_014f21db;
        uVar3 = uVar5;
        if (uVar2 != 0) {
          piVar8 = &result_data[uVar7].micros;
          for (uVar9 = 0; uVar3 = uVar9 + uVar7, uVar9 + uVar7 < uVar5; uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              iVar10 = Interval::GetDifference
                                 ((timestamp_t)ldata->value,(timestamp_t)rdata[uVar7 + uVar9].value)
              ;
              ((interval_t *)(piVar8 + -1))->months = (int)iVar10._0_8_;
              ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
              *piVar8 = iVar10.micros;
            }
            piVar8 = piVar8 + 2;
          }
        }
      }
      uVar7 = uVar3;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}